

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr<PartialJPDPValuePair>
          (shared_ptr<PartialPolicyPoolItemInterface> *this,PartialJPDPValuePair *p)

{
  sp_counted_base *in_RSI;
  shared_count *in_RDI;
  PartialJPDPValuePair *p_00;
  shared_ptr<PartialPolicyPoolItemInterface> *in_stack_ffffffffffffffe0;
  
  in_RDI->pi_ = in_RSI;
  p_00 = (PartialJPDPValuePair *)(in_RDI + 1);
  detail::shared_count::shared_count((shared_count *)p_00);
  detail::sp_pointer_construct<PartialPolicyPoolItemInterface,PartialJPDPValuePair>
            (in_stack_ffffffffffffffe0,p_00,in_RDI);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }